

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  string *psVar6;
  uint64 uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  WeightParamType *wt;
  LayerUnion LVar11;
  WeightParams *pWVar12;
  pointer pWVar13;
  long lVar14;
  long *plVar15;
  size_type *psVar16;
  WeightParamType WVar17;
  int iVar18;
  uint64_t uVar19;
  int iVar20;
  uint uVar21;
  InternalMetadataWithArenaLite *pIVar22;
  long lVar23;
  string err;
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  size_type *local_118;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> local_88;
  LayerUnion local_68;
  uint64 local_60;
  uint64_t local_58;
  string local_50;
  
  Result::Result((Result *)&local_118);
  validateInputCount((Result *)local_b0,layer,1,2);
  local_118 = (size_type *)local_b0;
  std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
  pcVar2 = local_a0 + 8;
  if (local_a8._M_p != pcVar2) {
    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
  }
  bVar9 = Result::good((Result *)&local_118);
  if (bVar9) {
    validateOutputCount((Result *)local_b0,layer,2,2);
    local_118 = (size_type *)local_b0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
    if (local_a8._M_p != pcVar2) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
  }
  bVar9 = Result::good((Result *)&local_118);
  if ((!bVar9) || (bVar9 = Result::good((Result *)&local_118), !bVar9)) goto LAB_002c43d1;
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GRU","");
    validateInputOutputRankEquality((Result *)local_b0,layer,&local_50,&this->blobNameToRank);
    local_118 = (size_type *)local_b0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
    if (local_a8._M_p != pcVar2) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar9 = Result::good((Result *)&local_118);
    if (!bVar9) {
LAB_002c43d1:
      *(size_type **)__return_storage_ptr__ = local_118;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p == &local_100) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_100._8_8_;
      }
      else {
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_110._M_p;
        (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
             CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_message)._M_string_length = local_108;
      return __return_storage_ptr__;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
    validateRankCount((Result *)local_b0,layer,&local_f0,5,5,&this->blobNameToRank);
    local_118 = (size_type *)local_b0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
    if (local_a8._M_p != pcVar2) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    bVar9 = Result::good((Result *)&local_118);
    if (!bVar9) goto LAB_002c43d1;
  }
  if (layer->_oneof_case_[0] == 0x19a) {
    LVar11 = layer->layer_;
  }
  else {
    LVar11.gru_ = Specification::GRULayerParams::default_instance();
  }
  bVar9 = (LVar11.gru_)->hasbiasvectors_;
  local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_start = (WeightParamType *)0x0;
  local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (WeightParamType *)0x0;
  local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (WeightParamType *)0x0;
  pWVar12 = (LVar11.batchnorm_)->variance_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar18 = (pWVar12->floatvalue_).current_size_;
  sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar21 = (0 < iVar18) + 1;
  if (sVar3 == 0) {
    uVar21 = (uint)(0 < iVar18);
  }
  sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar8 = (uint)(sVar5 == 0);
  uVar21 = (uVar21 - (sVar4 == 0)) + 2;
  local_b0._0_4_ = UNSPECIFIED;
  if (uVar21 - uVar8 < 2) {
    local_b0._0_4_ = EMPTY;
    if (uVar21 != uVar8) {
      local_b0._0_4_ = (uint)(iVar18 < 1);
    }
    if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
        (((sVar4 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)
         ) || (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
      local_b0._0_4_ = EMPTY;
    }
  }
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
  _M_realloc_insert<CoreML::WeightParamType>(&local_88,(iterator)0x0,(WeightParamType *)local_b0);
  pWVar12 = (LVar11.scale_)->scale_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar18 = (pWVar12->floatvalue_).current_size_;
  sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar21 = (0 < iVar18) + 1;
  if (sVar3 == 0) {
    uVar21 = (uint)(0 < iVar18);
  }
  sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar8 = (uint)(sVar5 == 0);
  uVar21 = (uVar21 - (sVar4 == 0)) + 2;
  local_b0._0_4_ = UNSPECIFIED;
  if (uVar21 - uVar8 < 2) {
    local_b0._0_4_ = EMPTY;
    if (uVar21 != uVar8) {
      local_b0._0_4_ = (uint)(iVar18 < 1);
    }
    if ((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
       ((((sVar4 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)) &&
        (((sVar5 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))))) {
      local_b0._0_4_ = EMPTY;
    }
  }
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_88,
               (iterator)
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
  }
  else {
    *local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
    local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar12 = (LVar11.gru_)->resetgateweightmatrix_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar18 = (pWVar12->floatvalue_).current_size_;
  sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar21 = (0 < iVar18) + 1;
  if (sVar3 == 0) {
    uVar21 = (uint)(0 < iVar18);
  }
  sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar8 = (uint)(sVar5 == 0);
  uVar21 = (uVar21 - (sVar4 == 0)) + 2;
  local_b0._0_4_ = UNSPECIFIED;
  if (uVar21 - uVar8 < 2) {
    local_b0._0_4_ = EMPTY;
    if (uVar21 != uVar8) {
      local_b0._0_4_ = (uint)(iVar18 < 1);
    }
    if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
        (((sVar4 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)
         ) || (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
      local_b0._0_4_ = EMPTY;
    }
  }
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_88,
               (iterator)
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
  }
  else {
    *local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
    local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar12 = (LVar11.scale_)->bias_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar18 = (pWVar12->floatvalue_).current_size_;
  sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar21 = (0 < iVar18) + 1;
  if (sVar3 == 0) {
    uVar21 = (uint)(0 < iVar18);
  }
  sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar8 = (uint)(sVar5 == 0);
  uVar21 = (uVar21 - (sVar4 == 0)) + 2;
  local_b0._0_4_ = UNSPECIFIED;
  if (uVar21 - uVar8 < 2) {
    local_b0._0_4_ = EMPTY;
    if (uVar21 != uVar8) {
      local_b0._0_4_ = (uint)(iVar18 < 1);
    }
    if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
        (((sVar4 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)
         ) || (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
      local_b0._0_4_ = EMPTY;
    }
  }
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_88,
               (iterator)
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
  }
  else {
    *local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
    local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar12 = (LVar11.gru_)->outputgateweightmatrix_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar18 = (pWVar12->floatvalue_).current_size_;
  sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar21 = (0 < iVar18) + 1;
  if (sVar3 == 0) {
    uVar21 = (uint)(0 < iVar18);
  }
  sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar8 = (uint)(sVar5 == 0);
  uVar21 = (uVar21 - (sVar4 == 0)) + 2;
  local_b0._0_4_ = UNSPECIFIED;
  if (uVar21 - uVar8 < 2) {
    local_b0._0_4_ = EMPTY;
    if (uVar21 != uVar8) {
      local_b0._0_4_ = (uint)(iVar18 < 1);
    }
    if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
        (((sVar4 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)
         ) || (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
      local_b0._0_4_ = EMPTY;
    }
  }
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_88,
               (iterator)
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
  }
  else {
    *local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
    local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pWVar12 = (LVar11.gru_)->outputgaterecursionmatrix_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  iVar18 = (pWVar12->floatvalue_).current_size_;
  sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
  uVar21 = (0 < iVar18) + 1;
  if (sVar3 == 0) {
    uVar21 = (uint)(0 < iVar18);
  }
  sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
  uVar8 = (uint)(sVar5 == 0);
  uVar21 = (uVar21 - (sVar4 == 0)) + 2;
  local_b0._0_4_ = UNSPECIFIED;
  if (uVar21 - uVar8 < 2) {
    local_b0._0_4_ = EMPTY;
    if (uVar21 != uVar8) {
      local_b0._0_4_ = (uint)(iVar18 < 1);
    }
    if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
        (((sVar4 == 0 ||
          (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
         (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 || (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)
         ) || (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
      local_b0._0_4_ = EMPTY;
    }
  }
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
    _M_realloc_insert<CoreML::WeightParamType>
              (&local_88,
               (iterator)
               local_88.
               super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
               ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
  }
  else {
    *local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
     _M_impl.super__Vector_impl_data._M_finish = local_b0._0_4_;
    local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (bVar9 != false) {
    pWVar12 = (LVar11.gru_)->updategatebiasvector_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar18 = (pWVar12->floatvalue_).current_size_;
    sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
    uVar21 = (0 < iVar18) + 1;
    if (sVar3 == 0) {
      uVar21 = (uint)(0 < iVar18);
    }
    sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
    uVar8 = (uint)(sVar5 == 0);
    uVar21 = (uVar21 - (sVar4 == 0)) + 2;
    WVar17 = UNSPECIFIED;
    if (uVar21 - uVar8 < 2) {
      WVar17 = EMPTY;
      if (uVar21 != uVar8) {
        WVar17 = (uint)(iVar18 < 1);
      }
      if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
          (((sVar4 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (WVar17 = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (WVar17 = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
        WVar17 = EMPTY;
      }
    }
    if (local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_b0._0_4_ = WVar17;
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
    }
    else {
      *local_88.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = WVar17;
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar12 = (LVar11.gru_)->resetgatebiasvector_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar18 = (pWVar12->floatvalue_).current_size_;
    sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
    uVar21 = (0 < iVar18) + 1;
    if (sVar3 == 0) {
      uVar21 = (uint)(0 < iVar18);
    }
    sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
    uVar8 = (uint)(sVar5 == 0);
    uVar21 = (uVar21 - (sVar4 == 0)) + 2;
    local_b0._0_4_ = UNSPECIFIED;
    if (uVar21 - uVar8 < 2) {
      local_b0._0_4_ = EMPTY;
      if (uVar21 != uVar8) {
        local_b0._0_4_ = (uint)(iVar18 < 1);
      }
      if ((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
         ((((sVar4 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar5 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))))) {
        local_b0._0_4_ = EMPTY;
      }
    }
    if (local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
    }
    else {
      *local_88.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = local_b0._0_4_;
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pWVar12 = (LVar11.gru_)->outputgatebiasvector_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    iVar18 = (pWVar12->floatvalue_).current_size_;
    sVar3 = ((pWVar12->float16value_).ptr_)->_M_string_length;
    uVar21 = (0 < iVar18) + 1;
    if (sVar3 == 0) {
      uVar21 = (uint)(0 < iVar18);
    }
    sVar4 = ((pWVar12->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar12->int8rawvalue_).ptr_)->_M_string_length;
    uVar8 = (uint)(sVar5 == 0);
    uVar21 = (uVar21 - (sVar4 == 0)) + 2;
    local_b0._0_4_ = UNSPECIFIED;
    if (uVar21 - uVar8 < 2) {
      local_b0._0_4_ = EMPTY;
      if (uVar21 != uVar8) {
        local_b0._0_4_ = (uint)(iVar18 < 1);
      }
      if (((((sVar3 == 0) && (iVar18 < 1)) && (uVar21 != uVar8)) &&
          (((sVar4 == 0 ||
            (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
           (local_b0._0_4_ = QUINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) &&
         (((sVar5 == 0 ||
           (pWVar12 == (WeightParams *)&Specification::_WeightParams_default_instance_)) ||
          (local_b0._0_4_ = QINT, pWVar12->quantization_ == (QuantizationParams *)0x0)))) {
        local_b0._0_4_ = EMPTY;
      }
    }
    if (local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::
      _M_realloc_insert<CoreML::WeightParamType>
                (&local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(WeightParamType *)local_b0);
    }
    else {
      *local_88.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_finish = local_b0._0_4_;
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar18 = 0;
    iVar20 = 0;
    pWVar13 = local_88.
              super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (*pWVar13 == FLOAT16) {
        iVar20 = iVar20 + 1;
      }
      else if (*pWVar13 == FLOAT32) {
        iVar18 = iVar18 + 1;
      }
      if (0 < iVar18 * iVar20) {
        std::operator+(&local_f0,"GRU layer \'",(layer->name_).ptr_);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_f0);
        psVar16 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar16) {
          local_a0._0_8_ = *psVar16;
          local_a0._8_8_ = plVar15[3];
          local_b0 = (undefined1  [8])local_a0;
        }
        else {
          local_a0._0_8_ = *psVar16;
          local_b0 = (undefined1  [8])*plVar15;
        }
        local_a8._M_p = (pointer)plVar15[1];
        *plVar15 = (long)psVar16;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b0);
        if (local_b0 != (undefined1  [8])local_a0) {
          operator_delete((void *)local_b0,local_a0._0_8_ + 1);
        }
        goto LAB_002c5868;
      }
      pWVar13 = pWVar13 + 1;
    } while (pWVar13 !=
             local_88.
             super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_60 = (LVar11.gru_)->outputvectorsize_;
  pWVar12 = (LVar11.batchnorm_)->variance_;
  if (pWVar12 == (WeightParams *)0x0) {
    pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
  }
  uVar19 = (LVar11.gru_)->inputvectorsize_ * local_60;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_68 = LVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
  psVar6 = (layer->name_).ptr_;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"update gate weight matrix","");
  validateGeneralWeightParams((Result *)local_b0,pWVar12,uVar19,local_60,&local_f0,psVar6,&local_d0)
  ;
  local_118 = (size_type *)local_b0;
  std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
  if (local_a8._M_p != local_a0 + 8) {
    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
  }
  LVar11 = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  bVar10 = Result::good((Result *)&local_118);
  if (bVar10) {
    pWVar12 = (LVar11.gru_)->resetgateweightmatrix_;
    if (pWVar12 == (WeightParams *)0x0) {
      pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
    psVar6 = (layer->name_).ptr_;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"reset gate weight matrix","");
    validateGeneralWeightParams
              ((Result *)local_b0,pWVar12,uVar19,local_60,&local_f0,psVar6,&local_d0);
    local_118 = (size_type *)local_b0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
    if (local_a8._M_p != local_a0 + 8) {
      operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
    }
    LVar11 = local_68;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    bVar10 = Result::good((Result *)&local_118);
    if (bVar10) {
      pWVar12 = (LVar11.gru_)->outputgateweightmatrix_;
      if (pWVar12 == (WeightParams *)0x0) {
        pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
      psVar6 = (layer->name_).ptr_;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"output gate weight matrix","");
      validateGeneralWeightParams
                ((Result *)local_b0,pWVar12,uVar19,local_60,&local_f0,psVar6,&local_d0);
      local_118 = (size_type *)local_b0;
      std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
      if (local_a8._M_p != local_a0 + 8) {
        operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
      }
      LVar11 = local_68;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      bVar10 = Result::good((Result *)&local_118);
      if (bVar10) {
        pWVar12 = (LVar11.scale_)->scale_;
        if (pWVar12 == (WeightParams *)0x0) {
          pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
        }
        uVar7 = (LVar11.gru_)->outputvectorsize_;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
        psVar6 = (layer->name_).ptr_;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"update gate recursion matrix","");
        local_58 = uVar7 * uVar7;
        validateGeneralWeightParams
                  ((Result *)local_b0,pWVar12,local_58,local_60,&local_f0,psVar6,&local_d0);
        local_118 = (size_type *)local_b0;
        std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
        if (local_a8._M_p != local_a0 + 8) {
          operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
        }
        LVar11 = local_68;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        bVar10 = Result::good((Result *)&local_118);
        if (bVar10) {
          pWVar12 = (LVar11.scale_)->bias_;
          if (pWVar12 == (WeightParams *)0x0) {
            pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
          }
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
          psVar6 = (layer->name_).ptr_;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"reset gate recursion matrix","");
          validateGeneralWeightParams
                    ((Result *)local_b0,pWVar12,local_58,local_60,&local_f0,psVar6,&local_d0);
          local_118 = (size_type *)local_b0;
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
          if (local_a8._M_p != local_a0 + 8) {
            operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
          }
          LVar11 = local_68;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          bVar10 = Result::good((Result *)&local_118);
          if (bVar10) {
            pWVar12 = (LVar11.gru_)->outputgaterecursionmatrix_;
            if (pWVar12 == (WeightParams *)0x0) {
              pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
            psVar6 = (layer->name_).ptr_;
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"output gate recursion matrix","");
            validateGeneralWeightParams
                      ((Result *)local_b0,pWVar12,local_58,local_60,&local_f0,psVar6,&local_d0);
            local_118 = (size_type *)local_b0;
            std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
            if (local_a8._M_p != local_a0 + 8) {
              operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
            }
            LVar11 = local_68;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            bVar10 = Result::good((Result *)&local_118);
            if (bVar10) {
              if (bVar9 != false) {
                pWVar12 = (LVar11.gru_)->updategatebiasvector_;
                if (pWVar12 == (WeightParams *)0x0) {
                  pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                uVar19 = (LVar11.gru_)->outputvectorsize_;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
                psVar6 = (layer->name_).ptr_;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d0,"update gate bias vector","");
                validateGeneralWeightParams
                          ((Result *)local_b0,pWVar12,uVar19,1,&local_f0,psVar6,&local_d0);
                local_118 = (size_type *)local_b0;
                std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
                if (local_a8._M_p != local_a0 + 8) {
                  operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                }
                LVar11 = local_68;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                bVar9 = Result::good((Result *)&local_118);
                if (!bVar9) goto LAB_002c575c;
                pWVar12 = (LVar11.gru_)->resetgatebiasvector_;
                if (pWVar12 == (WeightParams *)0x0) {
                  pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
                psVar6 = (layer->name_).ptr_;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d0,"reset gate bias vector","");
                validateGeneralWeightParams
                          ((Result *)local_b0,pWVar12,uVar19,1,&local_f0,psVar6,&local_d0);
                local_118 = (size_type *)local_b0;
                std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
                if (local_a8._M_p != local_a0 + 8) {
                  operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                }
                LVar11 = local_68;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                bVar9 = Result::good((Result *)&local_118);
                if (!bVar9) goto LAB_002c575c;
                pWVar12 = (LVar11.gru_)->outputgatebiasvector_;
                if (pWVar12 == (WeightParams *)0x0) {
                  pWVar12 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                }
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GRU","");
                psVar6 = (layer->name_).ptr_;
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d0,"output gate bias vector","");
                validateGeneralWeightParams
                          ((Result *)local_b0,pWVar12,uVar19,1,&local_f0,psVar6,&local_d0);
                local_118 = (size_type *)local_b0;
                std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
                if (local_a8._M_p != local_a0 + 8) {
                  operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                }
                LVar11 = local_68;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                bVar9 = Result::good((Result *)&local_118);
                if (!bVar9) goto LAB_002c575c;
              }
              pIVar22 = &(LVar11.batchnorm_)->mean_->_internal_metadata_;
              if ((LVar11.batchnorm_)->mean_ == (WeightParams *)0x0) {
                pIVar22 = (InternalMetadataWithArenaLite *)0x0;
              }
              lVar14 = (long)(((RepeatedPtrField<CoreML::Specification::ActivationParams> *)
                              &(LVar11.convolution_)->kernelsize_)->super_RepeatedPtrFieldBase).
                             current_size_;
              if (lVar14 != 0) {
                lVar23 = 0;
                do {
                  validateRecurrentActivationParams
                            ((Result *)local_b0,
                             *(ActivationParams **)
                              ((long)&(pIVar22->
                                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                      ).ptr_ + lVar23));
                  local_118 = (size_type *)local_b0;
                  std::__cxx11::string::operator=((string *)&local_110,(string *)&local_a8);
                  if (local_a8._M_p != local_a0 + 8) {
                    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
                  }
                  bVar9 = Result::good((Result *)&local_118);
                  bVar10 = lVar14 * 8 + -8 != lVar23;
                  lVar23 = lVar23 + 8;
                } while (bVar9 && bVar10);
              }
            }
          }
        }
      }
    }
  }
LAB_002c575c:
  *(size_type **)__return_storage_ptr__ = local_118;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p == &local_100) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_100._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_110._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_108;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_110._M_p = (pointer)&local_100;
LAB_002c5868:
  if (local_88.super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
      ._M_impl.super__Vector_impl_data._M_start != (WeightParamType *)0x0) {
    operator_delete(local_88.
                    super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_p == &local_100) {
    return __return_storage_ptr__;
  }
  operator_delete(local_110._M_p,
                  CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;

    // Must specify hidden states
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "GRU", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "GRU", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate weight matrix");
    if (!r.good()) return r;

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate recursion matrix");
    if (!r.good()) return r;

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        r = validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "update gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "reset gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "output gate bias vector");
        if (!r.good()) return r;
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    return r;
}